

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool ModulusSimpleCaseHelper<long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::ModulusSimpleCase(longlong lhs,
                        SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
                        SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  long lVar1;
  
  if (rhs.m_int == -1) {
    lVar1 = 0;
  }
  else {
    if (rhs.m_int == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    lVar1 = lhs % rhs.m_int;
  }
  result->m_int = lVar1;
  return true;
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }